

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O1

char * MULTILABEL::bufread_label(labels *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  long lVar2;
  uint32_t temp;
  uint *local_38;
  uint local_2c;
  
  lVar2 = *(long *)c;
  local_38 = (uint *)c;
  v_array<unsigned_int>::clear(&ld->label_v);
  local_38 = local_38 + 2;
  sVar1 = io_buf::buf_read(cache,(char **)&local_38,(lVar2 << 0x22) >> 0x20);
  if (sVar1 < (ulong)(lVar2 * 4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error in demarshal of cost data",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  else if (lVar2 != 0) {
    do {
      local_2c = *local_38;
      local_38 = local_38 + 1;
      v_array<unsigned_int>::push_back(&ld->label_v,&local_2c);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (char *)local_38;
}

Assistant:

char* bufread_label(labels* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->label_v.clear();
  c += sizeof(size_t);
  size_t total = sizeof(uint32_t) * num;
  if (cache.buf_read(c, (int)total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    uint32_t temp = *(uint32_t*)c;
    c += sizeof(uint32_t);
    ld->label_v.push_back(temp);
  }

  return c;
}